

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O2

PAL_ERROR __thiscall
CorUnix::CPalSynchronizationManager::DispatchPendingAPCs
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent)

{
  CRITICAL_SECTION *pCriticalSection;
  _ThreadApcInfoNode *p_Var1;
  int new_level;
  PAL_ERROR PVar2;
  PThreadApcInfoNode pobj;
  int iVar3;
  
  pCriticalSection = &pthrCurrent->m_csLock;
  iVar3 = 0;
  do {
    InternalEnterCriticalSection(pthrCurrent,pCriticalSection);
    pobj = (pthrCurrent->apcInfo).m_ptainHead;
    if (pobj == (PThreadApcInfoNode)0x0) {
      InternalLeaveCriticalSection(pthrCurrent,pCriticalSection);
      PVar2 = 0x490;
      if (0 < iVar3) {
        PVar2 = 0;
      }
      return PVar2;
    }
    (pthrCurrent->apcInfo).m_ptainHead = (PThreadApcInfoNode)0x0;
    (pthrCurrent->apcInfo).m_ptainTail = (PThreadApcInfoNode)0x0;
    InternalLeaveCriticalSection(pthrCurrent,pCriticalSection);
    while (pobj != (_ThreadApcInfoNode *)0x0) {
      p_Var1 = pobj->pNext;
      new_level = DBG_change_entrylevel(0);
      if (PAL_InitializeChakraCoreCalled == false) {
        abort();
      }
      (*pobj->pfnAPC)(pobj->pAPCData);
      DBG_change_entrylevel(new_level);
      iVar3 = iVar3 + 1;
      CSynchCache<CorUnix::_ThreadApcInfoNode>::Add
                (&this->m_cacheThreadApcInfoNodes,pthrCurrent,pobj);
      pobj = p_Var1;
    }
  } while( true );
}

Assistant:

PAL_ERROR CPalSynchronizationManager::DispatchPendingAPCs(
        CPalThread * pthrCurrent)
    {
        ThreadApcInfoNode * ptainNode, * ptainLocalHead;
        int iAPCsCalled = 0;

        while (TRUE)
        {
            // Lock
            pthrCurrent->Lock(pthrCurrent);
            ptainLocalHead = pthrCurrent->apcInfo.m_ptainHead;
            if (ptainLocalHead)
            {
                pthrCurrent->apcInfo.m_ptainHead = NULL;
                pthrCurrent->apcInfo.m_ptainTail = NULL;
            }
            // Unlock
            pthrCurrent->Unlock(pthrCurrent);

            if (NULL == ptainLocalHead)
            {
                break;
            }

            while (ptainLocalHead)
            {
                ptainNode = ptainLocalHead;
                ptainLocalHead = ptainNode->pNext;

#if _ENABLE_DEBUG_MESSAGES_
                // reset ENTRY nesting level back to zero while
                // inside the callback ...
                int iOldLevel = DBG_change_entrylevel(0);
#endif /* _ENABLE_DEBUG_MESSAGES_ */

                TRACE("Calling APC %p with parameter %#x\n",
                      ptainNode->pfnAPC, ptainNode->pfnAPC);

                // Actual APC call
                ptainNode->pfnAPC(ptainNode->pAPCData);

#if _ENABLE_DEBUG_MESSAGES_
                // ... and set nesting level back to what it was
                DBG_change_entrylevel(iOldLevel);
#endif /* _ENABLE_DEBUG_MESSAGES_ */

                iAPCsCalled++;
                m_cacheThreadApcInfoNodes.Add(pthrCurrent, ptainNode);
            }
        }

        return (iAPCsCalled > 0) ? NO_ERROR : ERROR_NOT_FOUND;
    }